

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O3

QString * __thiscall
ExportDirWrapper::getLibraryName(QString *__return_storage_ptr__,ExportDirWrapper *this)

{
  bool bVar1;
  char *inp;
  storage_type *psVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  Data *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  
  inp = _getLibraryName(this);
  if (inp == (char *)0x0) {
    psVar2 = (storage_type *)0x0;
  }
  else {
    bVar1 = pe_util::isStrLonger(inp,100);
    if (!bVar1) {
      psVar2 = (storage_type *)strlen(inp);
      QVar4.m_data = psVar2;
      QVar4.m_size = (qsizetype)&local_38;
      QString::fromUtf8(QVar4);
      (__return_storage_ptr__->d).d = local_38;
      (__return_storage_ptr__->d).ptr = pcStack_30;
      goto LAB_0013305d;
    }
    psVar2 = (storage_type *)0x9;
  }
  QVar3.m_data = psVar2;
  QVar3.m_size = (qsizetype)&local_38;
  QString::fromUtf8(QVar3);
  (__return_storage_ptr__->d).d = local_38;
  (__return_storage_ptr__->d).ptr = pcStack_30;
LAB_0013305d:
  (__return_storage_ptr__->d).size = local_28;
  return __return_storage_ptr__;
}

Assistant:

QString ExportDirWrapper::getLibraryName()
{
    char *name = this->_getLibraryName();
    if (!name) return name;

    if (pe_util::isStrLonger(name, 100)) {
        return INVALID_NAME;
    }
    return QString(name);
}